

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O1

void __thiscall
duckdb::RowGroupCollection::InitializeCreateIndexScan
          (RowGroupCollection *this,CreateIndexScanState *state)

{
  mutex_type *pmVar1;
  RowGroupSegmentTree *pRVar2;
  unique_lock<std::mutex> local_20;
  
  pRVar2 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
  local_20._M_device = &(pRVar2->super_SegmentTree<duckdb::RowGroup,_true>).node_lock;
  local_20._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_20);
  pmVar1 = (state->segment_lock).lock._M_device;
  (state->segment_lock).lock._M_device = local_20._M_device;
  local_20._M_owns = (state->segment_lock).lock._M_owns;
  (state->segment_lock).lock._M_owns = true;
  local_20._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void RowGroupCollection::InitializeCreateIndexScan(CreateIndexScanState &state) {
	state.segment_lock = row_groups->Lock();
}